

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O0

LispPTR N_OP_iplusn(LispPTR tos,int n)

{
  float fVar1;
  ushort uVar2;
  float *pfVar3;
  uint *NAddr;
  uint uVar4;
  int *fixpp;
  float temp;
  int result;
  int arg1;
  int n_local;
  LispPTR tos_local;
  
  if ((tos & 0xfff0000) == 0xe0000) {
    temp = (float)(tos & 0xffff);
  }
  else if ((tos & 0xfff0000) == 0xf0000) {
    temp = (float)(tos | 0xffff0000);
  }
  else {
    uVar2 = *(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x7ff;
    if (uVar2 != 2) {
      if (uVar2 == 3) {
        pfVar3 = (float *)NativeAligned4FromLAddr(tos);
        fVar1 = *pfVar3;
        if ((fVar1 <= 2.1474836e+09) && (2.1474836e+09 <= fVar1)) {
          temp = (float)(int)fVar1;
          goto LAB_00108d28;
        }
      }
      MachineState.tosvalue = tos;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pfVar3 = (float *)NativeAligned4FromLAddr(tos);
    temp = *pfVar3;
  }
LAB_00108d28:
  uVar4 = (int)temp + n;
  if (SCARRY4((int)temp,n)) {
    MachineState.errorexit = 1;
    n_local = -1;
    MachineState.tosvalue = tos;
  }
  else if (uVar4 >> 0x10 == 0xffff) {
    n_local = uVar4 & 0xffff | 0xf0000;
  }
  else if (uVar4 >> 0x10 == 0) {
    n_local = uVar4 | 0xe0000;
  }
  else {
    NAddr = (uint *)createcell68k(2);
    *NAddr = uVar4;
    n_local = LAddrFromNative(NAddr);
  }
  return n_local;
}

Assistant:

LispPTR N_OP_iplusn(LispPTR tos, int n) {
  int arg1;
  int result;

  N_IGETNUMBER(tos, arg1, do_ufn);

#ifdef USE_OVERFLOW_BUILTINS

  if (__builtin_sadd_overflow(arg1, n, &result)) {
    ERROR_EXIT(tos);
  }
  N_ARITH_SWITCH(result);

#else

  result = arg1 + n;
  if ((result < 0) && (arg1 >= 0)) { ERROR_EXIT(tos); }
  N_ARITH_SWITCH(result);

#endif

do_ufn:
  ERROR_EXIT(tos);
}